

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V2Convert(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  uint8 uVar3;
  uint uVar4;
  int iVar5;
  long in_RDI;
  int yy;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int j;
  int l;
  int i;
  uint8 *c;
  uint8 *y;
  uint8 *d1;
  uint8 *d0;
  int row;
  int local_3c;
  int local_38;
  int local_34;
  byte *local_30;
  long local_28;
  uint8 *local_20;
  uint8 *local_18;
  
  uVar4 = *(int *)(in_RDI + 0x240) - *(int *)(in_RDI + 0x280);
  local_18 = *(uint8 **)(in_RDI + 0x3538);
  local_20 = *(uint8 **)(in_RDI + 0x3540);
  if ((int)uVar4 < 8) {
    local_28 = *(long *)(in_RDI + 0x2530) + (long)(int)(uVar4 * 8);
  }
  else {
    local_28 = *(long *)(in_RDI + 0x2530) + 0x80 + (long)(int)((uVar4 & 7) << 3);
  }
  local_30 = (byte *)(*(long *)(in_RDI + 0x2530) + 0x100 + (long)(((int)uVar4 >> 1) << 3));
  for (local_34 = *(int *)(in_RDI + 0x24d0); 0 < local_34; local_34 = local_34 + -1) {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < 8; local_3c = local_3c + 2) {
        iVar1 = *(int *)(in_RDI + 0x2538 + (long)(int)(uint)local_30[0x40] * 4);
        iVar5 = *(int *)(in_RDI + 0x2d38 + (long)(int)(uint)local_30[0x40] * 4) +
                *(int *)(in_RDI + 0x3138 + (long)(int)(uint)*local_30 * 4) >> 0x10;
        iVar2 = *(int *)(in_RDI + 0x2938 + (long)(int)(uint)*local_30 * 4);
        uVar4 = (uint)*(byte *)(local_28 + local_3c);
        uVar3 = clamp(uVar4 + iVar1);
        *local_18 = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        local_18[1] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        local_18[2] = uVar3;
        local_18[3] = 0xff;
        uVar4 = (uint)*(byte *)(local_28 + (local_3c + 1));
        uVar3 = clamp(uVar4 + iVar1);
        local_18[4] = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        local_18[5] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        local_18[6] = uVar3;
        local_18[7] = 0xff;
        uVar4 = (uint)*(byte *)(local_28 + (local_3c + 8));
        uVar3 = clamp(uVar4 + iVar1);
        *local_20 = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        local_20[1] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        local_20[2] = uVar3;
        local_20[3] = 0xff;
        uVar4 = (uint)*(byte *)(local_28 + (local_3c + 9));
        uVar3 = clamp(uVar4 + iVar1);
        local_20[4] = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        local_20[5] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        local_20[6] = uVar3;
        local_20[7] = 0xff;
        local_18 = local_18 + 8;
        local_20 = local_20 + 8;
        local_30 = local_30 + 1;
      }
      local_28 = local_28 + 0x40;
    }
    local_28 = local_28 + 0x100;
    local_30 = local_30 + 0x178;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V2Convert() {
  int row = m_max_mcu_y_size - m_mcu_lines_left;
  uint8* d0 = m_pScan_line_0;
  uint8* d1 = m_pScan_line_1;
  uint8* y;
  uint8* c;

  if (row < 8)
    y = m_pSample_buf + row * 8;
  else
    y = m_pSample_buf + 64 * 2 + (row & 7) * 8;

  c = m_pSample_buf + 64 * 4 + (row >> 1) * 8;

  for (int i = m_max_mcus_per_row; i > 0; i--) {
    for (int l = 0; l < 2; l++) {
      for (int j = 0; j < 8; j += 2) {
        int cb = c[0];
        int cr = c[64];

        int rc = m_crr[cr];
        int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
        int bc = m_cbb[cb];

        int yy = y[j];
        d0[0] = clamp(yy + rc);
        d0[1] = clamp(yy + gc);
        d0[2] = clamp(yy + bc);
        d0[3] = 255;

        yy = y[j + 1];
        d0[4] = clamp(yy + rc);
        d0[5] = clamp(yy + gc);
        d0[6] = clamp(yy + bc);
        d0[7] = 255;

        yy = y[j + 8];
        d1[0] = clamp(yy + rc);
        d1[1] = clamp(yy + gc);
        d1[2] = clamp(yy + bc);
        d1[3] = 255;

        yy = y[j + 8 + 1];
        d1[4] = clamp(yy + rc);
        d1[5] = clamp(yy + gc);
        d1[6] = clamp(yy + bc);
        d1[7] = 255;

        d0 += 8;
        d1 += 8;

        c++;
      }
      y += 64;
    }

    y += 64 * 6 - 64 * 2;
    c += 64 * 6 - 8;
  }
}